

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O1

void __thiscall
slang::parsing::Preprocessor::predefine(Preprocessor *this,string *definition,string_view name)

{
  char_pointer puVar1;
  size_t *psVar2;
  group_type_pointer pgVar3;
  size_t __n;
  uint uVar4;
  value_type_pointer ppVar5;
  TokenKind TVar6;
  Token TVar7;
  int iVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  char_pointer puVar10;
  uint uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *arrays_;
  group_type_pointer pgVar16;
  ulong uVar17;
  char_pointer puVar18;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>
  *args;
  table_element_pointer ppVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  iterator iVar39;
  string_view source;
  locator res;
  value_type *elements;
  Preprocessor pp;
  long local_480;
  undefined1 local_478 [16];
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>
  *local_468;
  undefined8 uStack_460;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_458;
  Preprocessor *local_450;
  uint64_t local_448;
  ulong local_440;
  size_t local_438;
  ulong local_430;
  ulong local_428;
  value_type_pointer local_420;
  long local_418;
  char *local_410;
  ulong local_408;
  group_type_pointer local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  uchar local_3d8;
  uchar uStack_3d7;
  uchar uStack_3d6;
  uchar uStack_3d5;
  uchar uStack_3d4;
  uchar uStack_3d3;
  uchar uStack_3d2;
  uchar uStack_3d1;
  uchar uStack_3d0;
  uchar uStack_3cf;
  uchar uStack_3ce;
  uchar uStack_3cd;
  uchar uStack_3cc;
  uchar uStack_3cb;
  uchar uStack_3ca;
  uchar uStack_3c9;
  undefined1 local_3c8 [472];
  Token local_1f0;
  Token local_1e0 [27];
  
  Preprocessor((Preprocessor *)local_3c8,this);
  std::operator+(&local_3f8,"`define ",definition);
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_3f8,"\n");
  local_478._0_8_ = (pbVar9->_M_dataplus)._M_p;
  paVar12 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._0_8_ == paVar12) {
    local_468 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>
                 *)paVar12->_M_allocated_capacity;
    uStack_460 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
    local_478._0_8_ = (group15<boost::unordered::detail::foa::plain_integral> *)&local_468;
  }
  else {
    local_468 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>
                 *)paVar12->_M_allocated_capacity;
  }
  local_478._8_8_ = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  source._M_str = (char *)local_478._0_8_;
  source._M_len = local_478._8_8_;
  pushSource((Preprocessor *)local_3c8,source,name);
  if ((group15<boost::unordered::detail::foa::plain_integral> *)local_478._0_8_ !=
      (group15<boost::unordered::detail::foa::plain_integral> *)&local_468) {
    operator_delete((void *)local_478._0_8_,(size_t)((long)&(local_468->first)._M_len + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
  }
  do {
    if (local_1f0.info == (Info *)0x0) {
      local_1f0 = nextProcessed((Preprocessor *)local_3c8);
    }
    TVar7 = local_1f0;
    TVar6 = local_1f0.kind;
    local_1e0[0].kind = local_1f0.kind;
    local_1e0[0]._2_1_ = local_1f0._2_1_;
    local_1e0[0].numFlags.raw = local_1f0.numFlags.raw;
    local_1e0[0].rawLen = local_1f0.rawLen;
    local_1e0[0].info = local_1f0.info;
    local_1f0 = TVar7;
    Token::Token((Token *)local_478);
    local_1f0.info = (Info *)local_478._8_8_;
    local_1f0.kind = local_478._0_2_;
    local_1f0._2_1_ = local_478[2];
    local_1f0.numFlags.raw = local_478[3];
    local_1f0.rawLen = local_478._4_4_;
  } while (TVar6 != EndOfFile);
  iVar39 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
           ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                    *)(local_3c8 + 0x168));
  if (iVar39.p_ == (table_element_pointer)0x0) {
LAB_006a0d04:
    ~Preprocessor((Preprocessor *)local_3c8);
    return;
  }
  arrays_ = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)&this->macros;
  local_458 = arrays_;
  local_450 = this;
LAB_006a0a5a:
  args = iVar39.p_;
  if ((args->second).intrinsic == None) {
    (args->second).commandLine = true;
    local_448 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                          (arrays_,&args->first);
    uVar14 = local_448 >>
             ((byte)(this->macros).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                    .arrays.groups_size_index & 0x3f);
    pgVar16 = (this->macros).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
              .arrays.groups_;
    lVar15 = (local_448 & 0xff) * 4;
    uVar23 = (&UNK_009584ac)[lVar15];
    uVar24 = (&UNK_009584ad)[lVar15];
    uVar25 = (&UNK_009584ae)[lVar15];
    uVar26 = (&UNK_009584af)[lVar15];
    local_420 = (this->macros).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                .arrays.elements_;
    uVar13 = (ulong)((uint)local_448 & 7);
    local_438 = (this->macros).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                .arrays.groups_size_mask;
    uVar17 = 0;
    uVar27 = uVar23;
    uVar28 = uVar24;
    uVar29 = uVar25;
    uVar30 = uVar26;
    uVar31 = uVar23;
    uVar32 = uVar24;
    uVar33 = uVar25;
    uVar34 = uVar26;
    uVar35 = uVar23;
    uVar36 = uVar24;
    uVar37 = uVar25;
    uVar38 = uVar26;
    local_428 = uVar14;
    do {
      ppVar5 = local_420;
      local_418 = uVar14 * 0x10;
      pgVar3 = pgVar16 + uVar14;
      auVar21[0] = -(pgVar3->m[0].n == uVar23);
      auVar21[1] = -(pgVar3->m[1].n == uVar24);
      auVar21[2] = -(pgVar3->m[2].n == uVar25);
      auVar21[3] = -(pgVar3->m[3].n == uVar26);
      auVar21[4] = -(pgVar3->m[4].n == uVar27);
      auVar21[5] = -(pgVar3->m[5].n == uVar28);
      auVar21[6] = -(pgVar3->m[6].n == uVar29);
      auVar21[7] = -(pgVar3->m[7].n == uVar30);
      auVar21[8] = -(pgVar3->m[8].n == uVar31);
      auVar21[9] = -(pgVar3->m[9].n == uVar32);
      auVar21[10] = -(pgVar3->m[10].n == uVar33);
      auVar21[0xb] = -(pgVar3->m[0xb].n == uVar34);
      auVar21[0xc] = -(pgVar3->m[0xc].n == uVar35);
      auVar21[0xd] = -(pgVar3->m[0xd].n == uVar36);
      auVar21[0xe] = -(pgVar3->m[0xe].n == uVar37);
      auVar21[0xf] = -(pgVar3->m[0xf].n == uVar38);
      uVar11 = (uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe);
      local_430 = uVar14;
      if (uVar11 != 0) {
        __n = (args->first)._M_len;
        local_410 = (args->first)._M_str;
        local_440 = uVar13;
        local_408 = uVar17;
        local_400 = pgVar16;
        local_3d8 = uVar23;
        uStack_3d7 = uVar24;
        uStack_3d6 = uVar25;
        uStack_3d5 = uVar26;
        uStack_3d4 = uVar27;
        uStack_3d3 = uVar28;
        uStack_3d2 = uVar29;
        uStack_3d1 = uVar30;
        uStack_3d0 = uVar31;
        uStack_3cf = uVar32;
        uStack_3ce = uVar33;
        uStack_3cd = uVar34;
        uStack_3cc = uVar35;
        uStack_3cb = uVar36;
        uStack_3ca = uVar37;
        uStack_3c9 = uVar38;
        do {
          iVar8 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
            }
          }
          bVar20 = __n == *(size_t *)
                           ((long)&ppVar5[uVar14 * 0xf].first._M_len + (ulong)(uint)(iVar8 << 5));
          local_480 = (long)&ppVar5[uVar14 * 0xf].first._M_len + (ulong)(uint)(iVar8 << 5);
          if (bVar20 && __n != 0) {
            iVar8 = bcmp(local_410,*(void **)(local_480 + 8),__n);
            bVar20 = iVar8 == 0;
            pgVar16 = local_400;
            uVar17 = local_408;
            uVar23 = local_3d8;
            uVar24 = uStack_3d7;
            uVar25 = uStack_3d6;
            uVar26 = uStack_3d5;
            uVar27 = uStack_3d4;
            uVar28 = uStack_3d3;
            uVar29 = uStack_3d2;
            uVar30 = uStack_3d1;
            uVar31 = uStack_3d0;
            uVar32 = uStack_3cf;
            uVar33 = uStack_3ce;
            uVar34 = uStack_3cd;
            uVar35 = uStack_3cc;
            uVar36 = uStack_3cb;
            uVar37 = uStack_3ca;
            uVar38 = uStack_3c9;
          }
          arrays_ = local_458;
          this = local_450;
          if (bVar20) goto LAB_006a0c45;
          uVar11 = uVar11 - 1 & uVar11;
          uVar13 = local_440;
        } while (uVar11 != 0);
      }
      if ((pgVar16->m[local_418 + 0xf].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[uVar13]) == 0) break;
      lVar15 = local_430 + uVar17;
      uVar17 = uVar17 + 1;
      uVar14 = lVar15 + 1U & local_438;
    } while (uVar17 <= local_438);
    local_480 = 0;
LAB_006a0c45:
    if (local_480 == 0) {
      if ((this->macros).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
          .size_ctrl.size <
          (this->macros).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
        ::
        nosize_unchecked_emplace_at<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>const&>
                  ((locator *)local_478,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
                    *)arrays_,(arrays_type *)arrays_,local_428,local_448,args);
        psVar2 = &(this->macros).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                  .size_ctrl.size;
        *psVar2 = *psVar2 + 1;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
        ::
        unchecked_emplace_with_rehash<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>const&>
                  ((locator *)local_478,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
                    *)arrays_,local_448,args);
      }
    }
  }
  puVar18 = iVar39.pc_ + 2;
  do {
    puVar10 = puVar18;
    puVar18 = iVar39.pc_;
    ppVar19 = iVar39.p_ + 1;
    if (((uint)iVar39.pc_ & 0xf) == 0xe) goto LAB_006a0c93;
    puVar1 = puVar10 + -1;
    iVar39.p_ = ppVar19;
    iVar39.pc_ = puVar18 + 1;
    puVar18 = puVar10 + 1;
  } while (*puVar1 == '\0');
  puVar10 = puVar10 + -1;
  if (*puVar1 == '\x01') {
    ppVar19 = (table_element_pointer)0x0;
  }
  goto LAB_006a0a96;
LAB_006a0c93:
  do {
    auVar22[0] = -(*puVar10 == '\0');
    auVar22[1] = -(puVar10[1] == '\0');
    auVar22[2] = -(puVar10[2] == '\0');
    auVar22[3] = -(puVar10[3] == '\0');
    auVar22[4] = -(puVar10[4] == '\0');
    auVar22[5] = -(puVar10[5] == '\0');
    auVar22[6] = -(puVar10[6] == '\0');
    auVar22[7] = -(puVar10[7] == '\0');
    auVar22[8] = -(puVar10[8] == '\0');
    auVar22[9] = -(puVar10[9] == '\0');
    auVar22[10] = -(puVar10[10] == '\0');
    auVar22[0xb] = -(puVar10[0xb] == '\0');
    auVar22[0xc] = -(puVar10[0xc] == '\0');
    auVar22[0xd] = -(puVar10[0xd] == '\0');
    auVar22[0xe] = -(puVar10[0xe] == '\0');
    auVar22[0xf] = -(puVar10[0xf] == '\0');
    uVar11 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe);
    if (uVar11 == 0x7fff) {
      puVar10 = puVar10 + 0x10;
      ppVar19 = ppVar19 + 0xf;
    }
    else {
      uVar4 = 0;
      if ((uVar11 ^ 0x7fff) != 0) {
        for (; ((uVar11 ^ 0x7fff) >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      if (puVar10[uVar4] == '\x01') {
        ppVar19 = (table_element_pointer)0x0;
      }
      else {
        puVar10 = puVar10 + uVar4;
        ppVar19 = (table_element_pointer)((long)&(ppVar19->first)._M_len + (ulong)(uVar4 << 5));
      }
    }
  } while (uVar11 == 0x7fff);
LAB_006a0a96:
  iVar39.p_ = ppVar19;
  iVar39.pc_ = puVar10;
  if (ppVar19 == (table_element_pointer)0x0) goto LAB_006a0d04;
  goto LAB_006a0a5a;
}

Assistant:

void Preprocessor::predefine(const std::string& definition, std::string_view name) {
    Preprocessor pp(*this);
    pp.pushSource("`define " + definition + "\n", name);

    // Consume all of the definition text.
    while (pp.next().kind != TokenKind::EndOfFile) {
        // Nothing to do but keep going.
    }

    // Look for the macro in the temporary preprocessor's macro map.
    // Any macros found that are not the built-in intrinsic macros should
    // be copied over to our own map.
    for (auto& pair : pp.macros) {
        if (!pair.second.isIntrinsic()) {
            pair.second.commandLine = true;
            macros.insert(pair);
        }
    }
}